

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigInteger.cpp
# Opt level: O0

BigInteger *
BigIntegerLibrary::gcdex
          (BigInteger *__return_storage_ptr__,BigInteger *a,BigInteger *b,BigInteger *x,
          BigInteger *y)

{
  bool bVar1;
  BigInteger local_148;
  BigInteger local_128;
  BigInteger local_108;
  BigInteger local_e8;
  BigInteger local_c8;
  undefined1 local_a1;
  undefined1 local_a0 [8];
  BigInteger y1;
  BigInteger x1;
  BigInteger local_50;
  BigInteger *local_30;
  BigInteger *y_local;
  BigInteger *x_local;
  BigInteger *b_local;
  BigInteger *a_local;
  BigInteger *d;
  
  local_30 = y;
  y_local = x;
  x_local = b;
  b_local = a;
  a_local = __return_storage_ptr__;
  bVar1 = BigInteger::operator==(a,(BigInteger *)zero);
  if (bVar1) {
    BigInteger::operator=(y_local,(BigInteger *)zero);
    BigInteger::BigInteger(&local_50,1);
    BigInteger::operator=(local_30,&local_50);
    BigInteger::~BigInteger(&local_50);
    BigInteger::BigInteger(__return_storage_ptr__,b);
  }
  else {
    BigInteger::BigInteger((BigInteger *)&y1.isNegative);
    BigInteger::BigInteger((BigInteger *)local_a0);
    local_a1 = 0;
    BigInteger::operator%(&local_c8,b,a);
    BigInteger::BigInteger(&local_e8,a);
    gcdex(__return_storage_ptr__,&local_c8,&local_e8,(BigInteger *)&y1.isNegative,
          (BigInteger *)local_a0);
    BigInteger::~BigInteger(&local_e8);
    BigInteger::~BigInteger(&local_c8);
    BigInteger::operator/(&local_148,b,a);
    BigInteger::operator*(&local_128,&local_148,(BigInteger *)&y1.isNegative);
    BigInteger::operator-(&local_108,(BigInteger *)local_a0,&local_128);
    BigInteger::operator=(y_local,&local_108);
    BigInteger::~BigInteger(&local_108);
    BigInteger::~BigInteger(&local_128);
    BigInteger::~BigInteger(&local_148);
    BigInteger::operator=(local_30,(BigInteger *)&y1.isNegative);
    local_a1 = 1;
    BigInteger::~BigInteger((BigInteger *)local_a0);
    BigInteger::~BigInteger((BigInteger *)&y1.isNegative);
  }
  return __return_storage_ptr__;
}

Assistant:

BigInteger gcdex(BigInteger a, BigInteger b, BigInteger& x, BigInteger& y) {
        if (a == zero) {
            x = zero;
            y = BigInteger(1);
            return b;
        }
        BigInteger x1, y1;
        BigInteger d = gcdex(b % a, a, x1, y1);
        x = y1 - (b / a) * x1;
        y = x1;
        return d;
    }